

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_vcf_by_region.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  int iVar1;
  htsFile *hfp;
  bcf_hdr_t *pbVar2;
  bcf_srs_t *readers;
  size_t sVar3;
  ostream *poVar4;
  runtime_error *this;
  bcf1_t *pbVar5;
  
  if (argc != 3) {
    usage();
    return 1;
  }
  hfp = hts_open(argv[1],"r");
  if (hfp == (htsFile *)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Unable to open file.");
  }
  else {
    pbVar2 = bcf_hdr_read(hfp);
    if (pbVar2 != (bcf_hdr_t *)0x0) {
      readers = bcf_sr_init();
      bcf_sr_set_regions(readers,argv[2],0);
      bcf_sr_add_reader(readers,argv[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"chromosome\tposition\tnum_alleles",0x1f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      iVar1 = bcf_sr_next_line(readers);
      while (iVar1 != 0) {
        if (*readers->has_line == 0) {
          pbVar5 = (bcf1_t *)0x0;
        }
        else {
          pbVar5 = *readers->readers->buffer;
        }
        __s = pbVar2->id[1][pbVar5->rid].key;
        if (__s == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x16c2d0);
        }
        else {
          sVar3 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        iVar1 = bcf_sr_next_line(readers);
      }
      bcf_sr_destroy(readers);
      return 0;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Unable to read header.");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char* argv[]) {
    if(argc == 3) {
        //init
        htsFile *test_bcf = NULL;
        bcf_hdr_t *test_header = NULL;
        test_bcf = bcf_open(argv[1], "r");
        if(test_bcf == NULL) {
            throw std::runtime_error("Unable to open file.");
        }
        test_header = bcf_hdr_read(test_bcf);
        if(test_header == NULL) {
            throw std::runtime_error("Unable to read header.");
        }

        bcf_srs_t *sr = bcf_sr_init();
        bcf_sr_set_regions(sr, argv[2], 0);
        bcf_sr_add_reader(sr, argv[1]);
        std::cout << "chromosome\tposition\tnum_alleles" << std::endl;
        while (bcf_sr_next_line(sr)) {
            bcf1_t *line = bcf_sr_get_line(sr, 0);
            cout << bcf_hdr_id2name(test_header, line->rid) \
                 << "\t" << line->pos \
                 << "\t" << line->n_allele << endl;
        }
        bcf_sr_destroy(sr);
    } else {
        return usage();
    }
    return 0;
}